

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readandsynthesis.cpp
# Opt level: O0

void anon_unknown.dwarf_1ee::ReadCodedAperiodicity
               (char *filename,int f0_length,int fs,int fft_size,int number_of_dimensions,
               double **aperiodicity)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  double **aperiodicity_00;
  double *pdVar4;
  int local_38;
  int local_34;
  int i_1;
  int i;
  double **coded_aperiodicity;
  double **aperiodicity_local;
  int number_of_dimensions_local;
  int fft_size_local;
  int fs_local;
  int f0_length_local;
  char *filename_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)f0_length;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  aperiodicity_00 = (double **)operator_new__(uVar3);
  for (local_34 = 0; local_34 < f0_length; local_34 = local_34 + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)number_of_dimensions;
    uVar3 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pdVar4 = (double *)operator_new__(uVar3);
    aperiodicity_00[local_34] = pdVar4;
  }
  ReadAperiodicity(filename,aperiodicity_00);
  DecodeAperiodicity(aperiodicity_00,f0_length,fs,fft_size,aperiodicity);
  for (local_38 = 0; local_38 < f0_length; local_38 = local_38 + 1) {
    if (aperiodicity_00[local_38] != (double *)0x0) {
      operator_delete__(aperiodicity_00[local_38]);
    }
  }
  if (aperiodicity_00 != (double **)0x0) {
    operator_delete__(aperiodicity_00);
  }
  return;
}

Assistant:

void ReadCodedAperiodicity(const char *filename, int f0_length, int fs,
    int fft_size, int number_of_dimensions, double **aperiodicity) {
  double **coded_aperiodicity = new double *[f0_length];
  for (int i = 0; i < f0_length; ++i)
    coded_aperiodicity[i] = new double[number_of_dimensions];
  ReadAperiodicity(filename, coded_aperiodicity);
  DecodeAperiodicity(coded_aperiodicity, f0_length, fs, fft_size,
      aperiodicity);
  for (int i = 0; i < f0_length; ++i) delete[] coded_aperiodicity[i];
  delete[] coded_aperiodicity;
}